

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.cpp
# Opt level: O0

void __thiscall Program::run_program(Program *this,EvalState *state)

{
  Statement *pSVar1;
  ControlClass C;
  ErrorException err;
  int local_1c;
  int num;
  EvalState *state_local;
  Program *this_local;
  
  for (local_1c = getFirstLineNumber(this); local_1c != this->end_line;
      local_1c = getNextLineNumber(this,local_1c)) {
    pSVar1 = getParsedStatement(this,local_1c);
    (*pSVar1->_vptr_Statement[2])(pSVar1,state);
  }
  return;
}

Assistant:

void Program::run_program(EvalState &state) {
    int num = getFirstLineNumber();
    while (num != end_line) {
        try {
            getParsedStatement(num)->execute(state);
        } catch (ControlClass C) {
            if (C.type == 0) { break; }
            if (C.type == 1) {
                if (list_of_program.count(C.line_number)) {
                    num = C.line_number;
                    continue;
                } else cout << "LINE NUMBER ERROR" << endl;
            }
        }
        catch (ErrorException err) {
            cout << err.getMessage() << endl;
        }
        catch (...) {

        }
        num = getNextLineNumber(num);
    }
}